

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O2

void intgemm::TestMultiplyBiasRelu<intgemm::SSE2::Kernels16>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWriteRelu callback;
  anon_class_16_2_a84000ed callback_00;
  float *pfVar1;
  float *pfVar2;
  float *int_ref;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  result_type_conflict rVar6;
  AlignedVector<float> *pAVar7;
  AlignedVector<float> B;
  AlignedVector<float> test_C;
  AlignedVector<float> A;
  float unquant_mult;
  AlignedVector<float> bias;
  AlignedVector<short> A_prep;
  param_type local_15c0;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<short> B_quant;
  AlignedVector<short> B_prep;
  undefined4 uStack_1574;
  string local_1550;
  ostringstream info;
  mt19937 gen;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&info);
  poVar3 = std::operator<<((ostream *)&info,"16-bit SSE2");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'\t');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'\t');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  AlignedVector<float>::AlignedVector(&A,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&B,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&bias,(ulong)B_cols,0x40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  pfVar2 = A.mem_;
  local_15c0._M_a = -1.0;
  local_15c0._M_b = 1.0;
  lVar5 = A.size_ << 2;
  for (lVar4 = 0; pfVar1 = B.mem_, lVar5 != lVar4; lVar4 = lVar4 + 4) {
    rVar6 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_15c0,&gen);
    *(result_type_conflict *)((long)pfVar2 + lVar4) = rVar6;
  }
  lVar4 = CONCAT44(B.size_._4_4_,(Index)B.size_);
  for (lVar5 = 0; pfVar2 = bias.mem_, lVar4 << 2 != lVar5; lVar5 = lVar5 + 4) {
    rVar6 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_15c0,&gen);
    *(result_type_conflict *)((long)pfVar1 + lVar5) = rVar6;
  }
  for (lVar4 = 0; bias.size_ << 2 != lVar4; lVar4 = lVar4 + 4) {
    rVar6 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_15c0,&gen);
    *(result_type_conflict *)((long)pfVar2 + lVar4) = rVar6;
  }
  unquant_mult = 9.536743e-07;
  AlignedVector<short>::AlignedVector(&A_prep,A.size_,0x40);
  AlignedVector<short>::AlignedVector(&B_prep,CONCAT44(B.size_._4_4_,(Index)B.size_),0x40);
  SSE2::Kernels16::Quantize(A.mem_,A_prep.mem_,1024.0,width * A_rows);
  SSE2::Kernels16::PrepareB(B.mem_,B_prep.mem_,1024.0,width,B_cols);
  AlignedVector<float>::AlignedVector(&test_C,(ulong)(B_cols * A_rows),0x40);
  callback._4_4_ = uStack_1574;
  callback.unquant_mult = 9.536743e-07;
  callback.bias_addr = bias.mem_;
  callback.output_addr = test_C.mem_;
  pAVar7 = (AlignedVector<float> *)test_C.mem_;
  SSE2::Kernels16::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
            (A_prep.mem_,B_prep.mem_,A_rows,width,B_cols,callback);
  AlignedVector<short>::AlignedVector(&B_quant,CONCAT44(B.size_._4_4_,(Index)B.size_),0x40);
  SSE2::Kernels16::Quantize(B.mem_,B_quant.mem_,1024.0,(Index)B.size_);
  AlignedVector<float>::AlignedVector(&slowint_C,test_C.size_,0x40);
  callback_00.bias = pAVar7;
  callback_00.unquant_mult = (float *)&bias;
  references::
  Multiply<short,_short,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:460:99),_nullptr>
            ((references *)A_prep.mem_,B_quant.mem_,(short *)slowint_C.mem_,(float *)(ulong)A_rows,
             width,B_cols,(Index)&unquant_mult,callback_00);
  AlignedVector<float>::AlignedVector(&float_C,test_C.size_,0x40);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:465:86),_nullptr>
            (A.mem_,B.mem_,float_C.mem_,A_rows,width,B_cols,&bias);
  int_ref = slowint_C.mem_;
  pfVar1 = float_C.mem_;
  pfVar2 = test_C.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar1,int_ref,pfVar2,test_C.size_,&local_1550,int_tolerance,float_tolerance,
             MSE_float_tolerance,MSE_int_tolerance);
  std::__cxx11::string::~string((string *)&local_1550);
  free(float_C.mem_);
  free(slowint_C.mem_);
  free(B_quant.mem_);
  free(test_C.mem_);
  free(B_prep.mem_);
  free(A_prep.mem_);
  free(bias.mem_);
  free(B.mem_);
  free(A.mem_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&info);
  return;
}

Assistant:

void TestMultiplyBiasRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance = 0.1f, float float_tolerance = 1.0f, float MSE_float_tolerance = 0.0f, float MSE_int_tolerance = 0.0f) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWriteRelu(unquant_mult, bias.begin(), test_C.begin()));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, sum * unquant_mult + bias[info.col_idx]);
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, static_cast<float>(sum) + bias[info.col_idx]);
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}